

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

int Abc_NodeMinimumBase2(Abc_Obj_t *pNode)

{
  DdNode *bF;
  int iVar1;
  Vec_Str_t *vSupport;
  char *pcVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  DdNode *n;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if ((pNode->pNtk->ntkFunc != ABC_FUNC_BDD) || (pNode->pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                  ,0x3f,"int Abc_NodeMinimumBase2(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                  ,0x40,"int Abc_NodeMinimumBase2(Abc_Obj_t *)");
  }
  vSupport = (Vec_Str_t *)malloc(0x10);
  vSupport->nCap = 0x10;
  vSupport->nSize = 0;
  pcVar2 = (char *)malloc(0x10);
  vSupport->pArray = pcVar2;
  iVar1 = Abc_NodeSupport((DdNode *)((ulong)(pNode->field_5).pData & 0xfffffffffffffffe),vSupport,
                          (pNode->vFanins).nSize);
  iVar5 = (pNode->vFanins).nSize;
  if (iVar1 == iVar5) {
    pcVar2 = vSupport->pArray;
    iVar5 = 0;
  }
  else {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = 8;
    if (6 < iVar5 - 1U) {
      iVar4 = iVar5;
    }
    vNodes->nSize = 0;
    vNodes->nCap = iVar4;
    if (iVar4 == 0) {
      ppvVar3 = (void **)0x0;
    }
    else {
      ppvVar3 = (void **)malloc((long)iVar4 << 3);
    }
    vNodes->pArray = ppvVar3;
    Abc_NodeCollectFanins(pNode,vNodes);
    (pNode->vFanins).nSize = 0;
    if (0 < vNodes->nSize) {
      lVar6 = 0;
      do {
        if (vSupport->pArray[lVar6] != '\0') {
          Vec_IntPush(&pNode->vFanins,*(int *)((long)vNodes->pArray[lVar6] + 0x10));
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vNodes->nSize);
    }
    if (iVar1 != (pNode->vFanins).nSize) {
      __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                    ,0x52,"int Abc_NodeMinimumBase2(Abc_Obj_t *)");
    }
    bF = (DdNode *)(pNode->field_5).pData;
    n = Extra_bddRemapUp((DdManager *)pNode->pNtk->pManFunc,bF);
    (pNode->field_5).pData = n;
    Cudd_Ref(n);
    Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,bF);
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (void **)0x0;
    }
    free(vNodes);
    pcVar2 = vSupport->pArray;
    iVar5 = 1;
  }
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
    vSupport->pArray = (char *)0x0;
  }
  free(vSupport);
  return iVar5;
}

Assistant:

int Abc_NodeMinimumBase2( Abc_Obj_t * pNode )
{
    Vec_Str_t * vSupport;
    Vec_Ptr_t * vFanins;
    DdNode * bTemp;
    int i, nVars;

    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );

    // compute support
    vSupport = Vec_StrAlloc( 10 );
    nVars = Abc_NodeSupport( Cudd_Regular(pNode->pData), vSupport, Abc_ObjFaninNum(pNode) );
    if ( nVars == Abc_ObjFaninNum(pNode) )
    {
        Vec_StrFree( vSupport );
        return 0;
    }

    // add fanins
    vFanins = Vec_PtrAlloc( Abc_ObjFaninNum(pNode) );
    Abc_NodeCollectFanins( pNode, vFanins );
    Vec_IntClear( &pNode->vFanins );
    for ( i = 0; i < vFanins->nSize; i++ )
        if ( vSupport->pArray[i] != 0 ) // useful
            Vec_IntPush( &pNode->vFanins, Abc_ObjId((Abc_Obj_t *)vFanins->pArray[i]) );
    assert( nVars == Abc_ObjFaninNum(pNode) );

    // update the function of the node
    pNode->pData = Extra_bddRemapUp( (DdManager *)pNode->pNtk->pManFunc, bTemp = (DdNode *)pNode->pData );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, bTemp );
    Vec_PtrFree( vFanins );
    Vec_StrFree( vSupport );
    return 1;
}